

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

void Cec_ManSimCreateInfo(Cec_ManSim_t *p,Vec_Ptr_t *vInfoCis,Vec_Ptr_t *vInfoCos)

{
  void *pvVar1;
  void *pvVar2;
  uint uVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  
  pGVar4 = p->pAig;
  if (p->pPars->fSeqSimulate != 0) {
    uVar3 = pGVar4->nRegs;
    uVar6 = (ulong)uVar3;
    if (0 < (int)uVar3) {
      if ((vInfoCis == (Vec_Ptr_t *)0x0) || (vInfoCos == (Vec_Ptr_t *)0x0)) {
        __assert_fail("vInfoCis && vInfoCos",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                      ,0x32e,"void Cec_ManSimCreateInfo(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
      }
      pVVar5 = pGVar4->vCis;
      if ((int)uVar3 < pVVar5->nSize) {
        lVar10 = 0;
        do {
          if (vInfoCis->nSize <= lVar10) goto LAB_005cbb35;
          if (0 < p->nWords) {
            pvVar1 = vInfoCis->pArray[lVar10];
            lVar7 = 0;
            do {
              uVar3 = Gia_ManRandom(0);
              *(uint *)((long)pvVar1 + lVar7 * 4) = uVar3;
              lVar7 = lVar7 + 1;
            } while (lVar7 < p->nWords);
            pGVar4 = p->pAig;
          }
          lVar10 = lVar10 + 1;
          uVar6 = (ulong)pGVar4->nRegs;
          pVVar5 = pGVar4->vCis;
        } while (lVar10 < (long)((long)pVVar5->nSize - uVar6));
        if (pGVar4->nRegs < 1) {
          return;
        }
      }
      iVar8 = 0;
      while( true ) {
        uVar3 = (pVVar5->nSize - (int)uVar6) + iVar8;
        if (((((int)uVar3 < 0) || (vInfoCis->nSize <= (int)uVar3)) ||
            (uVar9 = (pGVar4->vCos->nSize - (int)uVar6) + iVar8, (int)uVar9 < 0)) ||
           (vInfoCos->nSize <= (int)uVar9)) break;
        if (0 < p->nWords) {
          pvVar1 = vInfoCis->pArray[uVar3];
          pvVar2 = vInfoCos->pArray[uVar9];
          lVar10 = 0;
          do {
            *(undefined4 *)((long)pvVar1 + lVar10 * 4) = *(undefined4 *)((long)pvVar2 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 < p->nWords);
          uVar6 = (ulong)(uint)pGVar4->nRegs;
        }
        iVar8 = iVar8 + 1;
        if ((int)uVar6 <= iVar8) {
          return;
        }
      }
LAB_005cbb35:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  if (0 < pGVar4->vCis->nSize) {
    lVar10 = 0;
    do {
      if (vInfoCis->nSize <= lVar10) goto LAB_005cbb35;
      if (0 < p->nWords) {
        pvVar1 = vInfoCis->pArray[lVar10];
        lVar7 = 0;
        do {
          uVar3 = Gia_ManRandom(0);
          *(uint *)((long)pvVar1 + lVar7 * 4) = uVar3;
          lVar7 = lVar7 + 1;
        } while (lVar7 < p->nWords);
        pGVar4 = p->pAig;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pGVar4->vCis->nSize);
  }
  return;
}

Assistant:

void Cec_ManSimCreateInfo( Cec_ManSim_t * p, Vec_Ptr_t * vInfoCis, Vec_Ptr_t * vInfoCos )
{
    unsigned * pRes0, * pRes1;
    int i, w;
    if ( p->pPars->fSeqSimulate && Gia_ManRegNum(p->pAig) > 0 )
    {
        assert( vInfoCis && vInfoCos );
        for ( i = 0; i < Gia_ManPiNum(p->pAig); i++ )
        {
            pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, i );
            for ( w = 0; w < p->nWords; w++ )
                pRes0[w] = Gia_ManRandom( 0 );
        }
        for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        {
            pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, Gia_ManPiNum(p->pAig) + i );
            pRes1 = (unsigned *)Vec_PtrEntry( vInfoCos, Gia_ManPoNum(p->pAig) + i );
            for ( w = 0; w < p->nWords; w++ )
                pRes0[w] = pRes1[w];
        }
    }
    else 
    {
        for ( i = 0; i < Gia_ManCiNum(p->pAig); i++ )
        {
            pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, i );
            for ( w = 0; w < p->nWords; w++ )
                pRes0[w] = Gia_ManRandom( 0 );
        }
    }
}